

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

void plutovg_canvas_save(plutovg_canvas_t *canvas)

{
  int *piVar1;
  plutovg_state_t *ppVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  plutovg_line_cap_t pVar6;
  plutovg_line_join_t pVar7;
  plutovg_operator_t pVar8;
  uint uVar9;
  uint uVar10;
  plutovg_state_t *ppVar11;
  plutovg_paint_t *ppVar12;
  plutovg_font_face_t *ppVar13;
  float *pfVar14;
  int iVar15;
  long lVar16;
  float *__src;
  
  ppVar11 = canvas->freed_state;
  if (ppVar11 == (plutovg_state_t *)0x0) {
    ppVar11 = plutovg_state_create();
  }
  else {
    canvas->freed_state = ppVar11->next;
  }
  ppVar2 = canvas->state;
  ppVar12 = plutovg_paint_reference(ppVar2->paint);
  ppVar11->paint = ppVar12;
  ppVar13 = plutovg_font_face_reference(ppVar2->font_face);
  ppVar11->font_face = ppVar13;
  fVar3 = (ppVar2->color).g;
  fVar4 = (ppVar2->color).b;
  fVar5 = (ppVar2->color).a;
  (ppVar11->color).r = (ppVar2->color).r;
  (ppVar11->color).g = fVar3;
  (ppVar11->color).b = fVar4;
  (ppVar11->color).a = fVar5;
  fVar3 = (ppVar2->matrix).f;
  (ppVar11->matrix).e = (ppVar2->matrix).e;
  (ppVar11->matrix).f = fVar3;
  fVar3 = (ppVar2->matrix).b;
  fVar4 = (ppVar2->matrix).c;
  fVar5 = (ppVar2->matrix).d;
  (ppVar11->matrix).a = (ppVar2->matrix).a;
  (ppVar11->matrix).b = fVar3;
  (ppVar11->matrix).c = fVar4;
  (ppVar11->matrix).d = fVar5;
  pVar6 = (ppVar2->stroke).style.cap;
  pVar7 = (ppVar2->stroke).style.join;
  fVar3 = (ppVar2->stroke).style.miter_limit;
  (ppVar11->stroke).style.width = (ppVar2->stroke).style.width;
  (ppVar11->stroke).style.cap = pVar6;
  (ppVar11->stroke).style.join = pVar7;
  (ppVar11->stroke).style.miter_limit = fVar3;
  (ppVar11->stroke).dash.offset = (ppVar2->stroke).dash.offset;
  (ppVar11->stroke).dash.array.size = 0;
  __src = (ppVar2->stroke).dash.array.data;
  if ((__src != (float *)0x0) && (iVar15 = (ppVar2->stroke).dash.array.size, 0 < iVar15)) {
    uVar10 = (ppVar11->stroke).dash.array.capacity;
    if ((int)uVar10 < iVar15) {
      uVar9 = 8;
      if (uVar10 != 0) {
        uVar9 = uVar10;
      }
      do {
        uVar10 = uVar9;
        uVar9 = uVar10 * 2;
      } while ((int)uVar10 < iVar15);
      pfVar14 = (float *)realloc((ppVar11->stroke).dash.array.data,(ulong)uVar10 << 2);
      (ppVar11->stroke).dash.array.data = pfVar14;
      (ppVar11->stroke).dash.array.capacity = uVar10;
      lVar16 = (long)(ppVar11->stroke).dash.array.size;
      __src = (ppVar2->stroke).dash.array.data;
      iVar15 = (ppVar2->stroke).dash.array.size;
    }
    else {
      pfVar14 = (ppVar11->stroke).dash.array.data;
      lVar16 = 0;
    }
    memcpy(pfVar14 + lVar16,__src,(long)iVar15 << 2);
    piVar1 = &(ppVar11->stroke).dash.array.size;
    *piVar1 = *piVar1 + (ppVar2->stroke).dash.array.size;
  }
  plutovg_span_buffer_copy(&ppVar11->clip_spans,&ppVar2->clip_spans);
  pVar8 = ppVar2->op;
  ppVar11->winding = ppVar2->winding;
  ppVar11->op = pVar8;
  fVar3 = ppVar2->opacity;
  ppVar11->font_size = ppVar2->font_size;
  ppVar11->opacity = fVar3;
  ppVar11->clipping = ppVar2->clipping;
  ppVar11->next = canvas->state;
  canvas->state = ppVar11;
  return;
}

Assistant:

void plutovg_canvas_save(plutovg_canvas_t* canvas)
{
    plutovg_state_t* new_state = canvas->freed_state;
    if(new_state == NULL)
        new_state = plutovg_state_create();
    else
        canvas->freed_state = new_state->next;
    plutovg_state_copy(new_state, canvas->state);
    new_state->next = canvas->state;
    canvas->state = new_state;
}